

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

string * __thiscall
license::base64_abi_cxx11_
          (string *__return_storage_ptr__,license *this,void *binaryData,size_t len,int lineLenght)

{
  int iVar1;
  uint uVar2;
  int lineLenght_00;
  char cVar3;
  int iVar4;
  
  uVar2 = (uint)((ulong)binaryData % 3);
  iVar1 = (uVar2 >> 1) + (uVar2 & 1) * 2;
  lineLenght_00 = (int)len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (iVar4 = 1; cVar3 = (char)__return_storage_ptr__, (ulong)(iVar4 - 1) <= (long)binaryData - 3U;
      iVar4 = iVar4 + 3) {
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::push_back(cVar3);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::push_back(cVar3);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::push_back(cVar3);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::push_back(cVar3);
  }
  if (iVar1 == 1) {
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::push_back(cVar3);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::push_back(cVar3);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
  }
  else {
    if (iVar1 != 2) goto LAB_001326f4;
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::push_back(cVar3);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
    std::__cxx11::string::push_back(cVar3);
    add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
  }
  std::__cxx11::string::push_back(cVar3);
  add_CR_if_needed(__return_storage_ptr__,lineLenght_00);
  std::__cxx11::string::push_back(cVar3);
LAB_001326f4:
  if ((lineLenght_00 != 0) &&
     ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] !=
      '\n')) {
    std::__cxx11::string::push_back(cVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

string base64(const void* binaryData, size_t len, int lineLenght) {
	const unsigned char* bin = (const unsigned char*)binaryData;

	// int rc = 0;  // result counter
	unsigned int byteNo;  // I need this after the loop

	int modulusLen = len % 3;
	int pad = ((modulusLen & 1) << 1) + ((modulusLen & 2) >> 1);  // 2 gives 1 and 1 gives 2, but 0 gives 0.

	const size_t flen = 4 * (len + pad) / 3;
	size_t totalLength = flen;
	if (lineLenght > 0) {
		totalLength += ((int)flen / lineLenght) + 3;
	}

	string encodeBuffer;
	encodeBuffer.reserve(totalLength);

	for (byteNo = 0; byteNo <= len - 3; byteNo += 3) {
		unsigned char BYTE0 = bin[byteNo];
		unsigned char BYTE1 = bin[byteNo + 1];
		unsigned char BYTE2 = bin[byteNo + 2];

		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[BYTE0 >> 2];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[((0x3 & BYTE0) << 4) + (BYTE1 >> 4)];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[((0x0f & BYTE1) << 2) + (BYTE2 >> 6)];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[0x3f & BYTE2];
	}

	if (pad == 2) {
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[bin[byteNo] >> 2];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[(0x3 & bin[byteNo]) << 4];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += '=';
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += '=';
	} else if (pad == 1) {
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[bin[byteNo] >> 2];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[((0x3 & bin[byteNo]) << 4) + (bin[byteNo + 1] >> 4)];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += b64[(0x0f & bin[byteNo + 1]) << 2];
		add_CR_if_needed(encodeBuffer, lineLenght);
		encodeBuffer += '=';
	}
	if (lineLenght && encodeBuffer[encodeBuffer.length() - 1] != '\n') {
		encodeBuffer += '\n';
	}
	return encodeBuffer;
}